

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O1

void __thiscall ktx::PrintDiff::endJsonSection(PrintDiff *this)

{
  OutputFormat OVar1;
  PrintIndent *pPVar2;
  _Alloc_hider _Var3;
  undefined1 auVar4 [16];
  long *plVar5;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *vargs;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_00;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_01;
  char *local_58 [2];
  ulong local_48;
  
  if ((this->jsonSection).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    if (this->jsonSectionEmpty == false) {
      OVar1 = this->outputFormat;
      pPVar2 = this->printIndent;
      local_48 = (ulong)(uint)(pPVar2->indentBase * pPVar2->indentWidth);
      local_58[0] = "";
      format_str.size_ = 5;
      format_str.data_ = "{:{}}";
      args.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_58;
      args.desc_ = 0x1c;
      ::fmt::v10::vprint<char>(pPVar2->os,format_str,args);
      local_58[0] = "\n";
      if (OVar1 == json_mini) {
        local_58[0] = "";
      }
      format_str_00.size_ = 2;
      format_str_00.data_ = "{}";
      args_00.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_58;
      args_00.desc_ = 0xc;
      ::fmt::v10::vprint<char>(pPVar2->os,format_str_00,args_00);
      pPVar2 = this->printIndent;
      local_48 = (ulong)(uint)((pPVar2->indentBase + 1) * pPVar2->indentWidth);
      local_58[0] = "";
      format_str_01.size_ = 5;
      format_str_01.data_ = "{:{}}";
      args_01.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_58;
      args_01.desc_ = 0x1c;
      ::fmt::v10::vprint<char>(pPVar2->os,format_str_01,args_01);
      format_str_02.size_ = 2;
      format_str_02.data_ = "}}";
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_58;
      ::fmt::v10::vprint<char>
                (pPVar2->os,format_str_02,
                 (basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>)
                 (auVar4 << 0x40));
    }
    if ((this->jsonSection).
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == true) {
      (this->jsonSection).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      _Var3._M_p = (this->jsonSection).
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload._M_value._M_dataplus._M_p;
      plVar5 = (long *)((long)&(this->jsonSection).
                               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ._M_payload + 0x10);
      if ((long *)_Var3._M_p != plVar5) {
        operator_delete(_Var3._M_p,*plVar5 + 1);
      }
    }
  }
  return;
}

Assistant:

void endJsonSection() {
        if (jsonSection.has_value()) {
            const auto nl = outputFormat != OutputFormat::json_mini ?  "\n" : "";
            if (!jsonSectionEmpty) {
                printIndent(0, "{}", nl);
                printIndent(1, "}}");
            }
            jsonSection.reset();
        }
    }